

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O1

int __thiscall
capnp::TwoPartyVatNetwork::accept
          (TwoPartyVatNetwork *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  WeakFulfillerBase *pWVar1;
  undefined8 *puVar2;
  long *plVar3;
  PromiseArenaMember *pPVar4;
  Connection *pCVar5;
  WeakFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
  *params;
  undefined4 in_register_00000034;
  long lVar6;
  PromiseFulfillerPair<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
  paf;
  PromiseArenaMember *local_60;
  WeakFulfillerBase *local_58;
  long *local_50;
  Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>
  local_48;
  _func_int **local_38;
  
  lVar6 = CONCAT44(in_register_00000034,__fd);
  if ((*(short *)(lVar6 + 0x34) == 0) && (*(char *)(lVar6 + 0x138) == '\0')) {
    *(undefined1 *)(lVar6 + 0x138) = 1;
    local_48.disposer = (Disposer *)(lVar6 + 0x348);
    *(int *)(lVar6 + 0x360) = *(int *)(lVar6 + 0x360) + 1;
    local_48.ptr = (Connection *)(lVar6 + 8);
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ThirdPartyCompletion,capnp::rpc::twoparty::ThirdPartyToAwait,capnp::rpc::twoparty::ThirdPartyToContact,capnp::rpc::twoparty::JoinResult>::Connection,decltype(nullptr)>>,kj::_::PromiseDisposer,kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ThirdPartyCompletion,capnp::rpc::twoparty::ThirdPartyToAwait,capnp::rpc::twoparty::ThirdPartyToContact,capnp::rpc::twoparty::JoinResult>::Connection,decltype(nullptr)>>
              ((PromiseDisposer *)&local_60,&local_48);
    pCVar5 = local_48.ptr;
    pPVar4 = local_60;
    local_60 = (PromiseArenaMember *)0x0;
    (this->super_TwoPartyVatNetworkBase).super_VatNetworkBase._vptr_VatNetworkBase =
         (_func_int **)pPVar4;
    if (local_48.ptr != (Connection *)0x0) {
      local_48.ptr = (Connection *)0x0;
      (**(local_48.disposer)->_vptr_Disposer)
                (local_48.disposer,
                 (pCVar5->super_Connection)._vptr_Connection[-2] +
                 (long)&(pCVar5->super_Connection)._vptr_Connection);
    }
  }
  else {
    params = (WeakFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
              *)operator_new(0x18);
    pWVar1 = &params->super_WeakFulfillerBase;
    (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
    (params->
    super_PromiseFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
    ).super_PromiseRejector._vptr_PromiseRejector = (_func_int **)&PTR_reject_006fd0e0;
    (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
         (_func_int **)&PTR_disposeImpl_006fd118;
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ThirdPartyCompletion,capnp::rpc::twoparty::ThirdPartyToAwait,capnp::rpc::twoparty::ThirdPartyToContact,capnp::rpc::twoparty::JoinResult>::Connection,decltype(nullptr)>,kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ThirdPartyCompletion,capnp::rpc::twoparty::ThirdPartyToAwait,capnp::rpc::twoparty::ThirdPartyToContact,capnp::rpc::twoparty::JoinResult>::Connection,decltype(nullptr)>>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ThirdPartyCompletion,capnp::rpc::twoparty::ThirdPartyToAwait,capnp::rpc::twoparty::ThirdPartyToContact,capnp::rpc::twoparty::JoinResult>::Connection,decltype(nullptr)>>&>
              ((PromiseDisposer *)&local_38,params);
    local_60 = (PromiseArenaMember *)local_38;
    puVar2 = *(undefined8 **)(lVar6 + 0x2f0);
    plVar3 = *(long **)(lVar6 + 0x2f8);
    *(WeakFulfillerBase **)(lVar6 + 0x2f0) = pWVar1;
    *(WeakFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>::Connection,_std::nullptr_t>_>
      **)(lVar6 + 0x2f8) = params;
    local_50 = (long *)0x0;
    local_58 = pWVar1;
    if (plVar3 != (long *)0x0) {
      (**(code **)*puVar2)(puVar2,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    plVar3 = local_50;
    (this->super_TwoPartyVatNetworkBase).super_VatNetworkBase._vptr_VatNetworkBase =
         (_func_int **)local_60;
    local_60 = (PromiseArenaMember *)0x0;
    if (local_50 != (long *)0x0) {
      local_50 = (long *)0x0;
      (**(local_58->super_Disposer)._vptr_Disposer)
                (local_58,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
    pPVar4 = local_60;
    if (local_60 != (PromiseArenaMember *)0x0) {
      local_60 = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose(pPVar4);
    }
  }
  return (int)this;
}

Assistant:

kj::Promise<kj::Own<TwoPartyVatNetworkBase::Connection>> TwoPartyVatNetwork::accept() {
  if (side == rpc::twoparty::Side::SERVER && !accepted) {
    accepted = true;
    return asConnection();
  } else {
    // Create a promise that will never be fulfilled.
    auto paf = kj::newPromiseAndFulfiller<kj::Own<TwoPartyVatNetworkBase::Connection>>();
    acceptFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }
}